

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input.cpp
# Opt level: O1

void __thiscall CInput::HandleJoystickHatMotionEvent(CInput *this,SDL_Event *Event)

{
  byte bVar1;
  int iVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  
  iVar3 = (*(this->super_IEngineInput).super_IInput.super_IInterface._vptr_IInterface[7])();
  if ((CONCAT44(extraout_var,iVar3) != 0) &&
     (*(Uint32 *)(CONCAT44(extraout_var,iVar3) + 0x78) == (Event->display).display)) {
    bVar1 = (Event->display).event;
    if (bVar1 < 2) {
      uVar4 = CJoystick::GetJoystickHatKey((uint)bVar1,(uint)(Event->display).padding1);
      uVar5 = (ulong)uVar4;
      if ((uint)bVar1 * 8 + 0x1b2 <= (uint)(Event->display).event * 8 + 0x1b9) {
        iVar3 = this->m_InputCounter;
        uVar6 = (ulong)(byte)(bVar1 << 3);
        do {
          if ((uVar5 - 0x1b2 != uVar6) && (this->m_aInputState[uVar6 + 0x1b2] == true)) {
            this->m_aInputState[uVar6 + 0x1b2] = false;
            iVar2 = (this->super_IEngineInput).super_IInput.m_NumEvents;
            lVar8 = (long)iVar2;
            if (lVar8 != 0x20) {
              (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar8].m_Key =
                   (int)uVar6 + 0x1b2;
              (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar8].m_Flags = 2;
              (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar8].m_aText[0] = '\0';
              (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar8].m_InputCount = iVar3;
              (this->super_IEngineInput).super_IInput.m_NumEvents = iVar2 + 1;
            }
          }
          uVar7 = uVar6 + 0x1b2;
          uVar6 = uVar6 + 1;
        } while (uVar7 < (ulong)(Event->display).event * 8 + 0x1b9);
      }
      if (-1 < (int)uVar4) {
        this->m_aInputState[uVar5] = true;
        iVar3 = this->m_InputCounter;
        this->m_aInputCount[uVar5] = (unsigned_short)iVar3;
        iVar2 = (this->super_IEngineInput).super_IInput.m_NumEvents;
        lVar8 = (long)iVar2;
        if (lVar8 != 0x20) {
          (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar8].m_Key = uVar4;
          (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar8].m_Flags = 1;
          (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar8].m_aText[0] = '\0';
          (this->super_IEngineInput).super_IInput.m_aInputEvents[lVar8].m_InputCount = iVar3;
          (this->super_IEngineInput).super_IInput.m_NumEvents = iVar2 + 1;
        }
      }
    }
  }
  return;
}

Assistant:

void CInput::HandleJoystickHatMotionEvent(const SDL_Event &Event)
{
	CJoystick *pJoystick = GetActiveJoystick();
	if(!pJoystick || pJoystick->GetInstanceID() != Event.jhat.which)
		return;
	if(Event.jhat.hat >= NUM_JOYSTICK_HATS)
		return;

	const int CurrentKey = CJoystick::GetJoystickHatKey(Event.jhat.hat, Event.jhat.value);

	for(int Key = KEY_JOY_HAT0_LEFTUP + Event.jhat.hat * NUM_JOYSTICK_BUTTONS_PER_HAT; Key <= KEY_JOY_HAT0_RIGHTDOWN + Event.jhat.hat * NUM_JOYSTICK_BUTTONS_PER_HAT; Key++)
	{
		if(Key != CurrentKey && m_aInputState[Key])
		{
			m_aInputState[Key] = false;
			AddEvent(0, Key, IInput::FLAG_RELEASE);
		}
	}

	if(CurrentKey >= 0)
	{
		m_aInputState[CurrentKey] = true;
		m_aInputCount[CurrentKey] = m_InputCounter;
		AddEvent(0, CurrentKey, IInput::FLAG_PRESS);
	}
}